

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_astFunctionApplicationNode_t **applicationNode;
  sysbvm_bitflags_t sVar1;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t value;
  bool bVar5;
  bool bVar6;
  size_t local_e0;
  size_t local_d8;
  size_t i_1;
  size_t i;
  size_t directApplicationArgumentCount;
  size_t startingArgumentIndex;
  size_t applicationArgumentCount;
  size_t expectedArgumentCount;
  size_t typeArgumentCount;
  _Bool isMemoizedTemplate;
  _Bool isVariadic;
  sysbvm_bitflags_t flags;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_48_6_34a7a802 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_astFunctionApplicationNode_t **functionApplicationNode;
  sysbvm_simpleFunctionType_t **simpleFunctionType;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  applicationNode = (sysbvm_astFunctionApplicationNode_t **)(arguments + 1);
  memset(&gcFrameRecord.roots,0,0x30);
  memset(&flags,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&flags);
  sVar1 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(*arguments + 0xf8));
  bVar5 = (sVar1 & 2) != 0;
  bVar6 = (sVar1 & 0x600) == 0x600;
  applicationArgumentCount = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x100));
  sVar2 = sysbvm_array_getSize((*applicationNode)->arguments);
  if ((bVar5) && (applicationArgumentCount == 0)) {
    sysbvm_error("Variadic applications require at least a single argument.");
  }
  local_e0 = applicationArgumentCount;
  if (bVar5) {
    local_e0 = applicationArgumentCount - 1;
  }
  i = local_e0;
  if (bVar6) {
    if (applicationArgumentCount == 0) {
      sysbvm_error("Memoized template requires at least a single argument.");
    }
    applicationArgumentCount = applicationArgumentCount - 1;
    i = local_e0 - 1;
  }
  if ((bVar5) && (sVar2 < i)) {
    sysbvm_error("Missing required arguments.");
  }
  else if ((!bVar5) && (sVar2 != applicationArgumentCount)) {
    sysbvm_error("Expected number of arguments is mismatching.");
  }
  sVar3 = sysbvm_array_create(context,applicationArgumentCount);
  for (i_1 = 0; i_1 < i; i_1 = i_1 + 1) {
    sVar4 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x100),(long)(int)(uint)bVar6 + i_1);
    gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_array_at((*applicationNode)->arguments,i_1);
    sVar4 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,(sysbvm_tuple_t)gcFrameRecord.roots,sVar4,arguments[2]);
    sysbvm_array_atPut(sVar3,i_1,sVar4);
  }
  if (bVar5) {
    sVar4 = sysbvm_array_create(context,sVar2 - i);
    for (local_d8 = i; local_d8 < sVar2; local_d8 = local_d8 + 1) {
      value = sysbvm_array_at((*applicationNode)->arguments,local_d8);
      sysbvm_array_atPut(sVar4,local_d8 - i,value);
    }
    sVar4 = sysbvm_astMakeArrayNode_create(context,((*applicationNode)->super).sourcePosition,sVar4)
    ;
    sVar4 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,sVar4,(context->roots).arrayType,arguments[2]);
    sysbvm_array_atPut(sVar3,i,sVar4);
  }
  sVar1 = sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags);
  sVar4 = sysbvm_tuple_bitflags_encode(sVar1 | (long)(int)(uint)!bVar6 | 2);
  (*applicationNode)->applicationFlags = sVar4;
  (*applicationNode)->arguments = sVar3;
  ((*applicationNode)->super).analyzedType = *(sysbvm_tuple_t *)(*arguments + 0x108);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&flags);
  sVar3 = sysbvm_astFunctionApplicationNode_optimizePureApplication(context,applicationNode);
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_simpleFunctionType_primitiveAnalyzeAndTypeCheckFunctionApplicationNode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_simpleFunctionType_t **simpleFunctionType = (sysbvm_simpleFunctionType_t**)&arguments[0];
    sysbvm_astFunctionApplicationNode_t **functionApplicationNode = (sysbvm_astFunctionApplicationNode_t**)&arguments[1];
    sysbvm_tuple_t *environment = &arguments[2];

    struct {
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        sysbvm_tuple_t expectedArgumentType;
        sysbvm_tuple_t variadicArguments;
        sysbvm_tuple_t variadicArgumentsNode;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_bitflags_t flags = sysbvm_tuple_bitflags_decode((*simpleFunctionType)->super.functionFlags);
    bool isVariadic = (flags & SYSBVM_FUNCTION_FLAGS_VARIADIC) != 0;
    bool isMemoizedTemplate = (flags & SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE) == SYSBVM_FUNCTION_FLAGS_MEMOIZED_TEMPLATE;

    size_t typeArgumentCount = sysbvm_array_getSize((*simpleFunctionType)->argumentTypes);
    size_t expectedArgumentCount = typeArgumentCount;
    size_t applicationArgumentCount = sysbvm_array_getSize((*functionApplicationNode)->arguments);
    size_t startingArgumentIndex = isMemoizedTemplate ? 1 : 0;
    if(isVariadic && typeArgumentCount == 0)
        sysbvm_error("Variadic applications require at least a single argument.");

    size_t directApplicationArgumentCount = isVariadic ? typeArgumentCount - 1 : typeArgumentCount;
    if(isMemoizedTemplate)
    {
        if(expectedArgumentCount == 0)
            sysbvm_error("Memoized template requires at least a single argument.");
        --expectedArgumentCount;
        --directApplicationArgumentCount;
    }

    if(isVariadic && applicationArgumentCount < directApplicationArgumentCount)
        sysbvm_error("Missing required arguments.");
    else if(!isVariadic && applicationArgumentCount != expectedArgumentCount)
        sysbvm_error("Expected number of arguments is mismatching.");

    gcFrame.analyzedArguments = sysbvm_array_create(context, expectedArgumentCount);
    for(size_t i = 0; i < directApplicationArgumentCount; ++i)
    {
        gcFrame.expectedArgumentType = sysbvm_array_at((*simpleFunctionType)->argumentTypes, startingArgumentIndex + i);
        gcFrame.argumentNode = sysbvm_array_at((*functionApplicationNode)->arguments, i);
        gcFrame.analyzedArgument = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.argumentNode, gcFrame.expectedArgumentType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, i, gcFrame.analyzedArgument);
    }

    // Analyze the variadic arguments.
    if(isVariadic)
    {
        gcFrame.variadicArguments = sysbvm_array_create(context, applicationArgumentCount - directApplicationArgumentCount);
        for(size_t i = directApplicationArgumentCount; i < applicationArgumentCount; ++i)
            sysbvm_array_atPut(gcFrame.variadicArguments, i - directApplicationArgumentCount, sysbvm_array_at((*functionApplicationNode)->arguments, i));

        gcFrame.variadicArgumentsNode = sysbvm_astMakeArrayNode_create(context, (*functionApplicationNode)->super.sourcePosition, gcFrame.variadicArguments);
        gcFrame.variadicArgumentsNode = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.variadicArgumentsNode, context->roots.arrayType, *environment);
        sysbvm_array_atPut(gcFrame.analyzedArguments, directApplicationArgumentCount, gcFrame.variadicArgumentsNode);
    }

    (*functionApplicationNode)->applicationFlags = sysbvm_tuple_bitflags_encode(sysbvm_tuple_bitflags_decode((*functionApplicationNode)->applicationFlags)
        | (isMemoizedTemplate ? 0 : SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK)
        | SYSBVM_FUNCTION_APPLICATION_FLAGS_VARIADIC_EXPANDED);
    (*functionApplicationNode)->arguments = gcFrame.analyzedArguments;
    (*functionApplicationNode)->super.analyzedType = (*simpleFunctionType)->resultType;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_astFunctionApplicationNode_optimizePureApplication(context, functionApplicationNode);
}